

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O3

tm * __thiscall
absl::lts_20240722::ToTM(tm *__return_storage_ptr__,lts_20240722 *this,Time t,TimeZone tz)

{
  undefined8 uVar1;
  ulong uVar2;
  undefined6 uVar3;
  undefined1 auVar4 [12];
  int iVar5;
  weekday wVar6;
  uint uVar7;
  long lVar8;
  char cVar9;
  undefined1 auVar10 [16];
  Time t_00;
  CivilInfo ci;
  TimeZone local_60;
  CivilInfo local_58;
  civil_second local_28;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined2 uVar13;
  
  local_60._4_4_ = (undefined4)((ulong)register0x00000008 >> 0x20);
  local_60._0_4_ = t.rep_.rep_lo_;
  *(undefined8 *)&__return_storage_ptr__->tm_isdst = 0;
  __return_storage_ptr__->tm_gmtoff = 0;
  __return_storage_ptr__->tm_mon = 0;
  __return_storage_ptr__->tm_year = 0;
  __return_storage_ptr__->tm_wday = 0;
  __return_storage_ptr__->tm_yday = 0;
  __return_storage_ptr__->tm_zone = (char *)0x0;
  t_00.rep_.rep_lo_ = t.rep_.rep_hi_.lo_;
  t_00.rep_.rep_hi_ = (HiRep)this;
  TimeZone::At(&local_58,&local_60,t_00);
  local_28.f_.ss = local_58.cs.f_.ss;
  uVar13 = CONCAT11(local_28.f_.ss,local_28.f_.ss);
  uVar1 = CONCAT35(CONCAT21(uVar13,local_58.cs.f_.mm),
                   CONCAT14(local_58.cs.f_.mm,local_58.cs.f_._9_4_));
  uVar3 = CONCAT51(CONCAT41((int)((ulong)uVar1 >> 0x20),local_58.cs.f_.hh),local_58.cs.f_.hh);
  cVar9 = local_58.cs.f_.d;
  uVar2 = CONCAT62(uVar3,CONCAT11(cVar9,cVar9));
  auVar12._8_4_ = 0;
  auVar12._0_8_ = uVar2;
  auVar12._12_2_ = uVar13;
  auVar12._14_2_ = uVar13;
  uVar13 = (undefined2)((ulong)uVar1 >> 0x20);
  auVar11._12_4_ = auVar12._12_4_;
  auVar11._8_2_ = 0;
  auVar11._0_8_ = uVar2;
  auVar11._10_2_ = uVar13;
  auVar10._10_6_ = auVar11._10_6_;
  auVar10._8_2_ = uVar13;
  auVar10._0_8_ = uVar2;
  uVar13 = (undefined2)uVar3;
  auVar4._4_8_ = auVar10._8_8_;
  auVar4._2_2_ = uVar13;
  auVar4._0_2_ = uVar13;
  __return_storage_ptr__->tm_sec = auVar11._12_4_ >> 0x18;
  __return_storage_ptr__->tm_min = auVar10._8_4_ >> 0x18;
  __return_storage_ptr__->tm_hour = auVar4._0_4_ >> 0x18;
  __return_storage_ptr__->tm_mday = (int)CONCAT11(cVar9,cVar9) >> 8;
  __return_storage_ptr__->tm_mon = local_58.cs.f_.m + -1;
  iVar5 = -0x80000000;
  if ((-0x7ffff895 < local_58.cs.f_.y) && (iVar5 = 0x7ffff893, local_58.cs.f_.y < 0x80000000)) {
    iVar5 = (int)local_58.cs.f_.y + -0x76c;
  }
  __return_storage_ptr__->tm_year = iVar5;
  local_28.f_.y = local_58.cs.f_.y;
  local_28.f_._8_4_ = SUB54(CONCAT41(local_58.cs.f_._9_4_,local_58.cs.f_.m),0);
  wVar6 = time_internal::cctz::detail::get_weekday(&local_28);
  if (wVar6 < (sunday|tuesday)) {
    __return_storage_ptr__->tm_wday = *(int *)(&DAT_0010c474 + (ulong)wVar6 * 4);
  }
  uVar7 = 0;
  if ((local_58.cs.f_.y & 3U) == 0 && '\x02' < local_58.cs.f_.m) {
    lVar8 = local_58.cs.f_.y * -0x70a3d70a3d70a3d7;
    uVar7 = 1;
    if ((lVar8 + 0x51eb851eb851eb8U >> 2 | lVar8 << 0x3e) < 0x28f5c28f5c28f5d) {
      uVar7 = (uint)((lVar8 + 0x51eb851eb851eb0U >> 4 | lVar8 << 0x3c) < 0xa3d70a3d70a3d7);
    }
  }
  __return_storage_ptr__->tm_yday =
       *(int *)(&DAT_0010c400 + (long)local_58.cs.f_.m * 4) + (int)cVar9 + uVar7 + -1;
  __return_storage_ptr__->tm_isdst = (uint)local_58.is_dst;
  return __return_storage_ptr__;
}

Assistant:

struct tm ToTM(absl::Time t, absl::TimeZone tz) {
  struct tm tm = {};

  const auto ci = tz.At(t);
  const auto& cs = ci.cs;
  tm.tm_sec = cs.second();
  tm.tm_min = cs.minute();
  tm.tm_hour = cs.hour();
  tm.tm_mday = cs.day();
  tm.tm_mon = cs.month() - 1;

  // Saturates tm.tm_year in cases of over/underflow, accounting for the fact
  // that tm.tm_year is years since 1900.
  if (cs.year() < std::numeric_limits<int>::min() + 1900) {
    tm.tm_year = std::numeric_limits<int>::min();
  } else if (cs.year() > std::numeric_limits<int>::max()) {
    tm.tm_year = std::numeric_limits<int>::max() - 1900;
  } else {
    tm.tm_year = static_cast<int>(cs.year() - 1900);
  }

  switch (GetWeekday(cs)) {
    case Weekday::sunday:
      tm.tm_wday = 0;
      break;
    case Weekday::monday:
      tm.tm_wday = 1;
      break;
    case Weekday::tuesday:
      tm.tm_wday = 2;
      break;
    case Weekday::wednesday:
      tm.tm_wday = 3;
      break;
    case Weekday::thursday:
      tm.tm_wday = 4;
      break;
    case Weekday::friday:
      tm.tm_wday = 5;
      break;
    case Weekday::saturday:
      tm.tm_wday = 6;
      break;
  }
  tm.tm_yday = GetYearDay(cs) - 1;
  tm.tm_isdst = ci.is_dst ? 1 : 0;

  return tm;
}